

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddAuto.c
# Opt level: O0

DdNode * extraBddSpaceFromFunction(DdManager *dd,DdNode *bF,DdNode *bG)

{
  int iVar1;
  int iVar2;
  DdNode *pDVar3;
  DdNode *pDVar4;
  DdNode *E;
  DdNode *T;
  int local_8c;
  int index;
  int LevelG;
  int LevelF;
  DdNode *bRes1;
  DdNode *bRes0;
  DdNode *bTemp2;
  DdNode *bTemp1;
  DdNode *bG1;
  DdNode *bG0;
  DdNode *bF1;
  DdNode *bF0;
  DdNode *bGR;
  DdNode *bFR;
  DdNode *bRes;
  DdNode *bG_local;
  DdNode *bF_local;
  DdManager *dd_local;
  
  pDVar3 = (DdNode *)((ulong)bF & 0xfffffffffffffffe);
  pDVar4 = (DdNode *)((ulong)bG & 0xfffffffffffffffe);
  if (pDVar3->index == 0x7fffffff) {
    if (bF == bG) {
      dd_local = (DdManager *)dd->one;
    }
    else {
      dd_local = (DdManager *)((ulong)dd->one ^ 1);
    }
  }
  else if (pDVar4->index == 0x7fffffff) {
    dd_local = (DdManager *)((ulong)dd->one ^ 1);
  }
  else if ((uint)bG < (uint)bF) {
    dd_local = (DdManager *)extraBddSpaceFromFunction(dd,bG,bF);
  }
  else {
    dd_local = (DdManager *)cuddCacheLookup2(dd,extraBddSpaceFromFunction,bF,bG);
    if (dd_local == (DdManager *)0x0) {
      iVar1 = dd->perm[pDVar3->index];
      iVar2 = dd->perm[pDVar4->index];
      if (iVar2 < iVar1) {
        local_8c = dd->invperm[iVar2];
        bG0 = bF;
        bF1 = bF;
      }
      else {
        local_8c = dd->invperm[iVar1];
        if (pDVar3 == bF) {
          bF1 = (pDVar3->type).kids.E;
          bG0 = (pDVar3->type).kids.T;
        }
        else {
          bF1 = (DdNode *)((ulong)(pDVar3->type).kids.E ^ 1);
          bG0 = (DdNode *)((ulong)(pDVar3->type).kids.T ^ 1);
        }
      }
      bTemp1 = bG;
      bG1 = bG;
      if (iVar2 <= iVar1) {
        if (pDVar4 == bG) {
          bG1 = (pDVar4->type).kids.E;
          bTemp1 = (pDVar4->type).kids.T;
        }
        else {
          bG1 = (DdNode *)((ulong)(pDVar4->type).kids.E ^ 1);
          bTemp1 = (DdNode *)((ulong)(pDVar4->type).kids.T ^ 1);
        }
      }
      pDVar3 = extraBddSpaceFromFunction(dd,bF1,bG1);
      if (pDVar3 == (DdNode *)0x0) {
        dd_local = (DdManager *)0x0;
      }
      else {
        *(int *)(((ulong)pDVar3 & 0xfffffffffffffffe) + 4) =
             *(int *)(((ulong)pDVar3 & 0xfffffffffffffffe) + 4) + 1;
        pDVar4 = extraBddSpaceFromFunction(dd,bG0,bTemp1);
        if (pDVar4 == (DdNode *)0x0) {
          Cudd_RecursiveDeref(dd,pDVar3);
          dd_local = (DdManager *)0x0;
        }
        else {
          *(int *)(((ulong)pDVar4 & 0xfffffffffffffffe) + 4) =
               *(int *)(((ulong)pDVar4 & 0xfffffffffffffffe) + 4) + 1;
          E = cuddBddAndRecur(dd,pDVar3,pDVar4);
          if (E == (DdNode *)0x0) {
            Cudd_RecursiveDeref(dd,pDVar3);
            Cudd_RecursiveDeref(dd,pDVar4);
            dd_local = (DdManager *)0x0;
          }
          else {
            *(int *)(((ulong)E & 0xfffffffffffffffe) + 4) =
                 *(int *)(((ulong)E & 0xfffffffffffffffe) + 4) + 1;
            Cudd_RecursiveDeref(dd,pDVar3);
            Cudd_RecursiveDeref(dd,pDVar4);
            pDVar3 = extraBddSpaceFromFunction(dd,bF1,bTemp1);
            if (pDVar3 == (DdNode *)0x0) {
              Cudd_RecursiveDeref(dd,E);
              dd_local = (DdManager *)0x0;
            }
            else {
              *(int *)(((ulong)pDVar3 & 0xfffffffffffffffe) + 4) =
                   *(int *)(((ulong)pDVar3 & 0xfffffffffffffffe) + 4) + 1;
              pDVar4 = extraBddSpaceFromFunction(dd,bG0,bG1);
              if (pDVar4 == (DdNode *)0x0) {
                Cudd_RecursiveDeref(dd,E);
                Cudd_RecursiveDeref(dd,pDVar3);
                dd_local = (DdManager *)0x0;
              }
              else {
                *(int *)(((ulong)pDVar4 & 0xfffffffffffffffe) + 4) =
                     *(int *)(((ulong)pDVar4 & 0xfffffffffffffffe) + 4) + 1;
                T = cuddBddAndRecur(dd,pDVar3,pDVar4);
                if (T == (DdNode *)0x0) {
                  Cudd_RecursiveDeref(dd,E);
                  Cudd_RecursiveDeref(dd,pDVar3);
                  Cudd_RecursiveDeref(dd,pDVar4);
                  dd_local = (DdManager *)0x0;
                }
                else {
                  *(int *)(((ulong)T & 0xfffffffffffffffe) + 4) =
                       *(int *)(((ulong)T & 0xfffffffffffffffe) + 4) + 1;
                  Cudd_RecursiveDeref(dd,pDVar3);
                  Cudd_RecursiveDeref(dd,pDVar4);
                  bFR = T;
                  if (E != T) {
                    if (((ulong)T & 1) == 0) {
                      bFR = cuddUniqueInter(dd,local_8c,T,E);
                      if (bFR == (DdNode *)0x0) {
                        Cudd_RecursiveDeref(dd,E);
                        Cudd_RecursiveDeref(dd,T);
                        return (DdNode *)0x0;
                      }
                    }
                    else {
                      pDVar3 = cuddUniqueInter(dd,local_8c,(DdNode *)((ulong)T ^ 1),
                                               (DdNode *)((ulong)E ^ 1));
                      if (pDVar3 == (DdNode *)0x0) {
                        Cudd_RecursiveDeref(dd,E);
                        Cudd_RecursiveDeref(dd,T);
                        return (DdNode *)0x0;
                      }
                      bFR = (DdNode *)((ulong)pDVar3 ^ 1);
                    }
                  }
                  *(int *)(((ulong)E & 0xfffffffffffffffe) + 4) =
                       *(int *)(((ulong)E & 0xfffffffffffffffe) + 4) + -1;
                  *(int *)(((ulong)T & 0xfffffffffffffffe) + 4) =
                       *(int *)(((ulong)T & 0xfffffffffffffffe) + 4) + -1;
                  cuddCacheInsert2(dd,extraBddSpaceFromFunction,bF,bG,bFR);
                  dd_local = (DdManager *)bFR;
                }
              }
            }
          }
        }
      }
    }
  }
  return &dd_local->sentinel;
}

Assistant:

DdNode * extraBddSpaceFromFunction( DdManager * dd, DdNode * bF, DdNode * bG )
{
    DdNode * bRes;
    DdNode * bFR, * bGR;

    bFR = Cudd_Regular( bF ); 
    bGR = Cudd_Regular( bG ); 
    if ( cuddIsConstant(bFR) )
    {
        if ( bF == bG )
            return b1;
        else 
            return b0;
    }
    if ( cuddIsConstant(bGR) )
        return b0;
    // both bFunc and bCore are not constants

    // the operation is commutative - normalize the problem
    if ( (unsigned)(ABC_PTRUINT_T)bF > (unsigned)(ABC_PTRUINT_T)bG )
        return extraBddSpaceFromFunction(dd, bG, bF);


    if ( (bRes = cuddCacheLookup2(dd, extraBddSpaceFromFunction, bF, bG)) )
        return bRes;
    else
    {
        DdNode * bF0, * bF1;
        DdNode * bG0, * bG1;
        DdNode * bTemp1, * bTemp2;
        DdNode * bRes0, * bRes1;
        int LevelF, LevelG;
        int index;

        LevelF = dd->perm[bFR->index];
        LevelG = dd->perm[bGR->index];
        if ( LevelF <= LevelG )
        {
            index = dd->invperm[LevelF];
            if ( bFR != bF )
            {
                bF0 = Cudd_Not( cuddE(bFR) );
                bF1 = Cudd_Not( cuddT(bFR) );
            }
            else
            {
                bF0 = cuddE(bFR);
                bF1 = cuddT(bFR);
            }
        }
        else
        {
            index = dd->invperm[LevelG];
            bF0 = bF1 = bF;
        }

        if ( LevelG <= LevelF )
        {
            if ( bGR != bG )
            {
                bG0 = Cudd_Not( cuddE(bGR) );
                bG1 = Cudd_Not( cuddT(bGR) );
            }
            else
            {
                bG0 = cuddE(bGR);
                bG1 = cuddT(bGR);
            }
        }
        else
            bG0 = bG1 = bG;

        bTemp1 = extraBddSpaceFromFunction( dd, bF0, bG0 );
        if ( bTemp1 == NULL ) 
            return NULL;
        cuddRef( bTemp1 );

        bTemp2 = extraBddSpaceFromFunction( dd, bF1, bG1 );
        if ( bTemp2 == NULL ) 
        {
            Cudd_RecursiveDeref( dd, bTemp1 );
            return NULL;
        }
        cuddRef( bTemp2 );


        bRes0  = cuddBddAndRecur( dd, bTemp1, bTemp2 );
        if ( bRes0 == NULL )
        {
            Cudd_RecursiveDeref( dd, bTemp1 );
            Cudd_RecursiveDeref( dd, bTemp2 );
            return NULL;
        }
        cuddRef( bRes0 );
        Cudd_RecursiveDeref( dd, bTemp1 );
        Cudd_RecursiveDeref( dd, bTemp2 );


        bTemp1  = extraBddSpaceFromFunction( dd, bF0, bG1 );
        if ( bTemp1 == NULL )
        {
            Cudd_RecursiveDeref( dd, bRes0 );
            return NULL;
        }
        cuddRef( bTemp1 );

        bTemp2  = extraBddSpaceFromFunction( dd, bF1, bG0 );
        if ( bTemp2 == NULL )
        {
            Cudd_RecursiveDeref( dd, bRes0 );
            Cudd_RecursiveDeref( dd, bTemp1 );
            return NULL;
        }
        cuddRef( bTemp2 );

        bRes1  = cuddBddAndRecur( dd, bTemp1, bTemp2 );
        if ( bRes1 == NULL )
        {
            Cudd_RecursiveDeref( dd, bRes0 );
            Cudd_RecursiveDeref( dd, bTemp1 );
            Cudd_RecursiveDeref( dd, bTemp2 );
            return NULL;
        }
        cuddRef( bRes1 );
        Cudd_RecursiveDeref( dd, bTemp1 );
        Cudd_RecursiveDeref( dd, bTemp2 );



        // consider the case when Res0 and Res1 are the same node 
        if ( bRes0 == bRes1 )
            bRes = bRes1;
        // consider the case when Res1 is complemented 
        else if ( Cudd_IsComplement(bRes1) ) 
        {
            bRes = cuddUniqueInter(dd, index, Cudd_Not(bRes1), Cudd_Not(bRes0));
            if ( bRes == NULL ) 
            {
                Cudd_RecursiveDeref(dd,bRes0);
                Cudd_RecursiveDeref(dd,bRes1);
                return NULL;
            }
            bRes = Cudd_Not(bRes);
        } 
        else 
        {
            bRes = cuddUniqueInter( dd, index, bRes1, bRes0 );
            if ( bRes == NULL ) 
            {
                Cudd_RecursiveDeref(dd,bRes0);
                Cudd_RecursiveDeref(dd,bRes1);
                return NULL;
            }
        }
        cuddDeref( bRes0 );
        cuddDeref( bRes1 );
            
        // insert the result into cache 
        cuddCacheInsert2(dd, extraBddSpaceFromFunction, bF, bG, bRes);
        return bRes;
    }
}